

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O1

bool __thiscall phyr::AccelBVH::intersectRay(AccelBVH *this,Ray *ray,SurfaceInteraction *si)

{
  LinearBVHNode *pLVar1;
  element_type *peVar2;
  double dVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  bool bVar17;
  long lVar18;
  long lVar19;
  undefined4 uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  int nodeStack [64];
  ulong local_168;
  uint local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  anon_union_4_2_b6662c1c_for_LinearBVHNode_1 aaStack_138 [66];
  
  auVar25._0_8_ = (ray->d).x;
  auVar25._8_8_ = (ray->d).y;
  auVar25 = divpd(_DAT_0018b0c0,auVar25);
  dVar26 = 1.0 / (ray->d).z;
  lVar18 = -(ulong)(auVar25._0_8_ < 0.0);
  lVar19 = -(ulong)(auVar25._8_8_ < 0.0);
  uVar20 = (undefined4)lVar19;
  local_168 = CONCAT44(uVar20,(int)lVar18) & 0x100000001;
  auVar4._8_4_ = uVar20;
  auVar4._0_8_ = lVar18;
  local_148._12_4_ = (int)((ulong)lVar19 >> 0x20);
  local_148._0_12_ = auVar4;
  uVar16 = 0;
  bVar17 = (auVar4 & (undefined1  [12])0x1) != (undefined1  [12])0x0;
  lVar18 = 0;
  if (bVar17) {
    lVar18 = 0x18;
  }
  uVar10 = 0x18;
  if (bVar17) {
    uVar10 = uVar16;
  }
  bVar17 = (auVar4 & (undefined1  [12])0x1) != (undefined1  [12])0x0;
  lVar19 = 0;
  if (bVar17) {
    lVar19 = 0x18;
  }
  uVar11 = 0x18;
  if (bVar17) {
    uVar11 = uVar16;
  }
  local_160 = (uint)(dVar26 < 0.0);
  lVar12 = 0;
  uVar8 = 0x18;
  if (dVar26 < 0.0) {
    lVar12 = 0x18;
    uVar8 = uVar16;
  }
  iVar13 = 0;
  bVar9 = false;
  bVar17 = false;
  local_158 = auVar25;
  do {
    pLVar1 = this->bvhNodes;
    dVar22 = (ray->o).x;
    dVar23 = (ray->o).y;
    dVar3 = (*(double *)(pLVar1[iVar13]._padding + lVar18 + -0x37) - dVar22) * auVar25._0_8_;
    dVar24 = (*(double *)(pLVar1[iVar13]._padding + lVar19 + -0x2f) - dVar23) * auVar25._8_8_;
    dVar21 = (*(double *)(pLVar1[iVar13]._padding + (uVar10 - 0x37)) - dVar22) * auVar25._0_8_ *
             1.0000000000000007;
    dVar22 = (*(double *)(pLVar1[iVar13]._padding + (uVar11 - 0x2f)) - dVar23) * auVar25._8_8_ *
             1.0000000000000007;
    auVar5._8_4_ = (int)-(ulong)(dVar22 < dVar3);
    auVar5._0_8_ = -(ulong)(dVar21 < dVar24);
    auVar5._12_4_ = (int)(-(ulong)(dVar22 < dVar3) >> 0x20);
    iVar7 = movmskpd(iVar13,auVar5);
    iVar15 = (int)uVar16;
    if (iVar7 == 0) {
      if (dVar21 <= dVar22) {
        dVar22 = dVar21;
      }
      dVar23 = (ray->o).z;
      dVar21 = (*(double *)(pLVar1[iVar13]._padding + lVar12 + -0x27) - dVar23) * dVar26;
      dVar23 = (*(double *)(pLVar1[iVar13]._padding + (uVar8 - 0x27)) - dVar23) * dVar26 *
               1.0000000000000007;
      if (dVar22 < dVar21) goto LAB_00131674;
      if (dVar24 <= dVar3) {
        dVar24 = dVar3;
      }
      if (dVar23 < dVar24) goto LAB_00131674;
      if (dVar21 <= dVar24) {
        dVar21 = dVar24;
      }
      if (ray->tMax <= dVar21) goto LAB_00131674;
      if (dVar22 <= dVar23) {
        dVar23 = dVar22;
      }
      if (dVar23 <= 0.0) goto LAB_00131674;
      if (pLVar1[iVar13].nObjects == 0) {
        if (*(int *)((long)&local_168 + (ulong)pLVar1[iVar13].splitAxis * 4) == 0) {
          uVar16 = (ulong)(iVar15 + 1);
          aaStack_138[iVar15] = pLVar1[iVar13].field_1;
          iVar13 = iVar13 + 1;
        }
        else {
          uVar16 = (ulong)(iVar15 + 1);
          aaStack_138[iVar15].objectStartIdx = iVar13 + 1;
          iVar13 = pLVar1[iVar13].field_1.objectStartIdx;
        }
        goto LAB_00131688;
      }
      if (pLVar1[iVar13].nObjects != 0) {
        lVar14 = 0;
        bVar17 = bVar9;
        do {
          peVar2 = (this->objectList).
                   super__Vector_base<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [pLVar1[iVar13].field_1.objectStartIdx + lVar14].
                   super___shared_ptr<phyr::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          iVar7 = (*peVar2->_vptr_Object[4])(peVar2,ray,si);
          if ((char)iVar7 != '\0') {
            bVar17 = true;
          }
          lVar14 = lVar14 + 1;
          bVar9 = bVar17;
        } while ((uint)lVar14 < (uint)pLVar1[iVar13].nObjects);
      }
      auVar25 = local_158;
      if (iVar15 == 0) {
        uVar16 = 0;
        bVar6 = false;
      }
      else {
        uVar16 = (ulong)(iVar15 - 1);
        iVar13 = aaStack_138[(long)iVar15 + -1].objectStartIdx;
        bVar6 = true;
      }
    }
    else {
LAB_00131674:
      if (iVar15 == 0) {
        uVar16 = 0;
        bVar6 = false;
      }
      else {
        uVar16 = (ulong)(iVar15 - 1);
        iVar13 = aaStack_138[(long)iVar15 + -1].objectStartIdx;
LAB_00131688:
        bVar6 = true;
      }
    }
    if (!bVar6) {
      return bVar17;
    }
  } while( true );
}

Assistant:

bool AccelBVH::intersectRay(const Ray& ray, SurfaceInteraction* si) const {
    bool intersected = false;
    // Initialize ray intersection parameters
    Vector3f invDir(1 / ray.d.x, 1 / ray.d.y, 1 / ray.d.z);
    int isDirNeg[3] = { invDir.x < 0, invDir.y < 0, invDir.z < 0 };

    // Test against each BVH node
    int nodeStack[64];
    int stackSize = 0, itrIdx = 0, i;

    while (true) {
        const LinearBVHNode* node = &bvhNodes[itrIdx];
        // Inspect current node
        if (node->bounds.intersectRay(ray, invDir, isDirNeg)) {
            if (node->nObjects > 0) {
                // Node is leaf. Test against all objects in leaf
                for (i = 0; i < node->nObjects; i++)
                    if (objectList[node->objectStartIdx + i]->intersectRay(ray, si))
                        intersected = true;
                if (stackSize == 0) break;
                itrIdx = nodeStack[--stackSize];
            } else {
                // Internal node. Test near nodes first. Put far nodes in the stack
                if (isDirNeg[node->splitAxis]) {
                    // Stash first child and inspect second child first
                    nodeStack[stackSize++] = itrIdx + 1;
                    itrIdx = node->secondChildIdx;
                } else {
                    // Stash second child and inspect first child first
                    nodeStack[stackSize++] = node->secondChildIdx;
                    itrIdx++;
                }
            }
        } else {
            if (stackSize == 0) break;
            itrIdx = nodeStack[--stackSize];
        }
    }

    return intersected;
}